

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logmath.c
# Opt level: O0

logmath_t * logmath_read(char *file_name)

{
  int32 iVar1;
  int iVar2;
  FILE *__stream;
  ulong uVar3;
  mmio_file_t *pmVar4;
  void *pvVar5;
  size_t sVar6;
  char *pcVar7;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 uVar8;
  FILE *fp;
  long pos;
  int local_40;
  uint32 chksum;
  int do_mmap;
  int chksum_present;
  int32 i;
  int32 byteswap;
  char **argval;
  char **argname;
  logmath_t *lmath;
  char *file_name_local;
  
  lmath = (logmath_t *)file_name;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
          ,0xaf,"Reading log table file \'%s\'\n",file_name);
  __stream = fopen((char *)lmath,"rb");
  if (__stream == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
                   ,0xb1,"Failed to open log table file \'%s\' for reading",lmath);
    return (logmath_t *)0x0;
  }
  iVar1 = bio_readhdr((FILE *)__stream,&argval,(char ***)&i,&chksum_present);
  if (iVar1 < 0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
            ,0xb7,"Failed to read the header from the file \'%s\'\n",lmath);
    fclose(__stream);
    return (logmath_t *)0x0;
  }
  argname = (char **)__ckd_calloc__(1,0x50,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
                                    ,0xbc);
  *(undefined1 *)((long)argname + 0xd) = 0;
  *(undefined1 *)((long)argname + 0xc) = 2;
  argname[4] = (char *)0x3ff00068db8bac71;
  chksum = 0;
  for (do_mmap = 0; uVar8 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20),
      argval[do_mmap] != (char *)0x0; do_mmap = do_mmap + 1) {
    iVar2 = strcmp(argval[do_mmap],"version");
    if (iVar2 != 0) {
      iVar2 = strcmp(argval[do_mmap],"chksum0");
      if (iVar2 == 0) {
        iVar2 = strcmp(_i[do_mmap],"yes");
        if (iVar2 == 0) {
          chksum = 1;
        }
      }
      else {
        iVar2 = strcmp(argval[do_mmap],"width");
        if (iVar2 == 0) {
          iVar2 = atoi(_i[do_mmap]);
          *(char *)((long)argname + 0xc) = (char)iVar2;
        }
        else {
          iVar2 = strcmp(argval[do_mmap],"shift");
          if (iVar2 == 0) {
            iVar2 = atoi(_i[do_mmap]);
            *(char *)((long)argname + 0xd) = (char)iVar2;
          }
          else {
            iVar2 = strcmp(argval[do_mmap],"logbase");
            if (iVar2 == 0) {
              pcVar7 = (char *)atof_c(_i[do_mmap]);
              argname[4] = pcVar7;
            }
          }
        }
      }
    }
  }
  bio_hdrarg_free(argval,_i);
  pos._4_4_ = 0;
  pcVar7 = (char *)log((double)argname[4]);
  argname[5] = pcVar7;
  pcVar7 = (char *)log10((double)argname[4]);
  argname[6] = pcVar7;
  argname[7] = (char *)(1.0 / (double)argname[5]);
  argname[8] = (char *)(1.0 / (double)argname[6]);
  *(int *)(argname + 9) = -0x80000000 >> (*(char *)((long)argname + 0xd) + 2U & 0x1f);
  iVar1 = bio_fread(argname + 1,4,1,(FILE *)__stream,chksum_present,(uint32 *)((long)&pos + 4));
  if (iVar1 == 1) {
    local_40 = 1;
    uVar3 = ftell(__stream);
    if ((uVar3 & (ulong)*(byte *)((long)argname + 0xc) - 1) != 0) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
              ,0xeb,"%s: Data start %ld is not aligned on %d-byte boundary, will not memory map\n",
              lmath,uVar3,CONCAT44(uVar8,(uint)*(byte *)((long)argname + 0xc)));
      local_40 = 0;
    }
    if (chksum_present != 0) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
              ,0xf0,"%s: Data is wrong-endian, will not memory map\n",lmath);
      local_40 = 0;
    }
    if (local_40 != 0) {
      pmVar4 = mmio_file_read((char *)lmath);
      argname[3] = (char *)pmVar4;
      pvVar5 = mmio_file_ptr((mmio_file_t *)argname[3]);
      *argname = (char *)((long)pvVar5 + uVar3);
LAB_001255a6:
      fclose(__stream);
      return (logmath_t *)argname;
    }
    pcVar7 = (char *)__ckd_calloc__((ulong)*(uint *)(argname + 1),
                                    (ulong)*(byte *)((long)argname + 0xc),
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
                                    ,0xf9);
    *argname = pcVar7;
    iVar1 = bio_fread(*argname,(uint)*(byte *)((long)argname + 0xc),*(int32 *)(argname + 1),
                      (FILE *)__stream,chksum_present,(uint32 *)((long)&pos + 4));
    if (iVar1 == *(int *)(argname + 1)) {
      if (chksum != 0) {
        bio_verify_chksum((FILE *)__stream,chksum_present,pos._4_4_);
      }
      sVar6 = fread(&do_mmap,1,1,__stream);
      if (sVar6 != 1) goto LAB_001255a6;
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
              ,0x104,"%s: More data than expected\n",lmath);
    }
    else {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
              ,0xfd,"Failed to read data (%d x %d bytes) from the file \'%s\' failed",
              (ulong)*(uint *)(argname + 1),(ulong)*(byte *)((long)argname + 0xc),lmath);
    }
  }
  else {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
            ,0xe2,"Failed to read values from the file \'%s\'",lmath);
  }
  logmath_free((logmath_t *)argname);
  return (logmath_t *)0x0;
}

Assistant:

logmath_t *
logmath_read(const char *file_name)
{
    logmath_t *lmath;
    char **argname, **argval;
    int32 byteswap, i;
    int chksum_present, do_mmap;
    uint32 chksum;
    long pos;
    FILE *fp;

    E_INFO("Reading log table file '%s'\n", file_name);
    if ((fp = fopen(file_name, "rb")) == NULL) {
        E_ERROR_SYSTEM("Failed to open log table file '%s' for reading", file_name);
        return NULL;
    }

    /* Read header, including argument-value info and 32-bit byteorder magic */
    if (bio_readhdr(fp, &argname, &argval, &byteswap) < 0) {
        E_ERROR("Failed to read the header from the file '%s'\n", file_name);
        fclose(fp);
        return NULL;
    }

    lmath = ckd_calloc(1, sizeof(*lmath));
    /* Default values. */
    lmath->t.shift = 0;
    lmath->t.width = 2;
    lmath->base = 1.0001;

    /* Parse argument-value list */
    chksum_present = 0;
    for (i = 0; argname[i]; i++) {
        if (strcmp(argname[i], "version") == 0) {
        }
        else if (strcmp(argname[i], "chksum0") == 0) {
            if (strcmp(argval[i], "yes") == 0)
                chksum_present = 1;
        }
        else if (strcmp(argname[i], "width") == 0) {
            lmath->t.width = atoi(argval[i]);
        }
        else if (strcmp(argname[i], "shift") == 0) {
            lmath->t.shift = atoi(argval[i]);
        }
        else if (strcmp(argname[i], "logbase") == 0) {
            lmath->base = atof_c(argval[i]);
        }
    }
    bio_hdrarg_free(argname, argval);
    chksum = 0;

    /* Set up various necessary constants. */
    lmath->log_of_base = log(lmath->base);
    lmath->log10_of_base = log10(lmath->base);
    lmath->inv_log_of_base = 1.0/lmath->log_of_base;
    lmath->inv_log10_of_base = 1.0/lmath->log10_of_base;
    /* Shift this sufficiently that overflows can be avoided. */
    lmath->zero = MAX_NEG_INT32 >> (lmath->t.shift + 2);

    /* #Values to follow */
    if (bio_fread(&lmath->t.table_size, sizeof(int32), 1, fp, byteswap, &chksum) != 1) {
        E_ERROR("Failed to read values from the file '%s'", file_name);
        goto error_out;
    }

    /* Check alignment constraints for memory mapping */
    do_mmap = 1;
    pos = ftell(fp);
    if (pos & ((long)lmath->t.width - 1)) {
        E_WARN("%s: Data start %ld is not aligned on %d-byte boundary, will not memory map\n",
                  file_name, pos, lmath->t.width);
        do_mmap = 0;
    }
    /* Check byte order for memory mapping */
    if (byteswap) {
        E_WARN("%s: Data is wrong-endian, will not memory map\n", file_name);
        do_mmap = 0;
    }

    if (do_mmap) {
        lmath->filemap = mmio_file_read(file_name);
        lmath->t.table = (char *)mmio_file_ptr(lmath->filemap) + pos;
    }
    else {
        lmath->t.table = ckd_calloc(lmath->t.table_size, lmath->t.width);
        if ((uint32)bio_fread(lmath->t.table, lmath->t.width, lmath->t.table_size,
                      fp, byteswap, &chksum) != lmath->t.table_size) {
            E_ERROR("Failed to read data (%d x %d bytes) from the file '%s' failed",
                    lmath->t.table_size, lmath->t.width, file_name);
            goto error_out;
        }
        if (chksum_present)
            bio_verify_chksum(fp, byteswap, chksum);

        if (fread(&i, 1, 1, fp) == 1) {
            E_ERROR("%s: More data than expected\n", file_name);
            goto error_out;
        }
    }
    fclose(fp);

    return lmath;
error_out:
    logmath_free(lmath);
    return NULL;
}